

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

void borg_sleep_kill(wchar_t i)

{
  ushort uVar1;
  borg_kill *pbVar2;
  char *pcVar3;
  
  pbVar2 = borg_kills;
  uVar1 = borg_kills[i].r_idx;
  if (uVar1 != 0) {
    if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
      pcVar3 = r_info[(uint)uVar1].name;
    }
    else {
      pcVar3 = "player ghost";
    }
    pcVar3 = format("# Noting sleep on a monster \'%s\' at (%d,%d)",pcVar3,
                    (ulong)(uint)borg_kills[i].pos.y,(ulong)(uint)borg_kills[i].pos.x);
    borg_note(pcVar3);
    pbVar2[i].awake = false;
    borg.goal.type = 0;
    borg_danger_wipe = true;
  }
  return;
}

Assistant:

void borg_sleep_kill(int i)
{
    borg_kill *kill = &borg_kills[i];

    /* Paranoia -- Already wiped */
    if (!kill->r_idx)
        return;

    /* Note */
    borg_note(format("# Noting sleep on a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));

    /* note sleep */
    kill->awake = false;

    /* Wipe flow goals */
    borg.goal.type = 0;

    /* Recalculate danger */
    borg_danger_wipe = true;
}